

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O2

HRESULT RunBgParseSync(LPCSTR fileContents,UINT lengthBytes,char *fileName)

{
  code *pcVar1;
  DWORD DVar2;
  JsErrorCode JVar3;
  size_t sVar4;
  DWORD_PTR DVar5;
  PAL_FILE *pPVar6;
  size_t i;
  size_t sVar7;
  WCHAR local_278 [4];
  WCHAR fileNameWide [260];
  JsValueRef local_48;
  JsValueRef bgResult;
  JsValueRef scriptSource;
  DWORD cookie;
  
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
            (fileContents,lengthBytes,(JsFinalizeCallback)0x0,fileContents,&bgResult);
  memset(local_278,0,0x208);
  sVar4 = strlen(fileName);
  for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
    local_278[sVar7] = (short)fileName[sVar7];
  }
  scriptSource._4_4_ = 0;
  fileNameWide._512_8_ = fileContents;
  JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtQueueBackgroundParse_Experimental)
                    ((JsScriptContents *)(fileNameWide + 0x100),(DWORD *)((long)&scriptSource + 4));
  DVar2 = scriptSource._4_4_;
  if (JVar3 == JsNoError) {
    local_48 = (JsValueRef)0x0;
    DVar5 = WScriptJsrt::GetNextSourceContext();
    JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtExecuteBackgroundParse_Experimental)
                      (DVar2,bgResult,DVar5,local_278,JsParseScriptAttributeNone,(JsValueRef)0x0,
                       &local_48);
    return JVar3;
  }
  pPVar6 = PAL_get_stderr(0);
  PAL_fprintf(pPVar6,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ch.cpp"
              ,0x2f5,"e == JsErrorCode::JsNoError","e == JsErrorCode::JsNoError");
  pPVar6 = PAL_get_stderr(0);
  PAL_fflush(pPVar6);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

HRESULT RunBgParseSync(LPCSTR fileContents, UINT lengthBytes, const char* fileName)
{
    JsValueRef scriptSource;
    JsErrorCode e = (ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents,
        (unsigned int)lengthBytes,
        nullptr, (void*)fileContents, &scriptSource));

    // What's the preferred way of doing this?
    WCHAR fileNameWide[MAX_PATH] = { 0 };
    size_t fileNameLength = strlen(fileName);
    for (size_t i = 0; i < fileNameLength; i++)
    {
        fileNameWide[i] = fileName[i];
    }

    JsScriptContents scriptContents = { 0 };
    scriptContents.container = (LPVOID)fileContents;
    scriptContents.containerType = JsScriptContainerType::HeapAllocatedBuffer;
    scriptContents.encodingType = JsScriptEncodingType::Utf8;
    scriptContents.contentLengthInBytes = lengthBytes;
    scriptContents.fullPath = fileNameWide;

    DWORD cookie = 0;
    e = ChakraRTInterface::JsQueueBackgroundParse_Experimental(&scriptContents, &cookie);
    Assert(e == JsErrorCode::JsNoError);

    JsValueRef bgResult = nullptr;
    e = ChakraRTInterface::JsExecuteBackgroundParse_Experimental(
        cookie,
        scriptSource,
        WScriptJsrt::GetNextSourceContext(),
        (WCHAR*)scriptContents.fullPath,
        JsParseScriptAttributes::JsParseScriptAttributeNone,
        nullptr,//_In_ JsValueRef parserState,
        &bgResult
    );

    return e;
}